

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  uint uVar2;
  vfloat<4> vVar3;
  size_t sVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [12];
  vbool<4> vVar25;
  bool bVar26;
  uint uVar27;
  undefined4 uVar28;
  int iVar29;
  long lVar30;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar31;
  size_t sVar32;
  size_t sVar33;
  uint uVar34;
  NodeRef *pNVar35;
  NodeRef root;
  long lVar36;
  ulong uVar37;
  long lVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 in_ZMM0 [64];
  float fVar54;
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar74;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar72;
  float fVar73;
  undefined1 auVar71 [64];
  float fVar75;
  float fVar89;
  float fVar90;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar92;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar91;
  float fVar93;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar110;
  float fVar116;
  float fVar117;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar118;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar123;
  float fVar124;
  float fVar130;
  float fVar132;
  undefined1 auVar125 [16];
  float fVar134;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar131;
  float fVar133;
  float fVar135;
  undefined1 auVar129 [16];
  float fVar136;
  float fVar137;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar146;
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar150 [64];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [64];
  float fVar158;
  float fVar159;
  undefined1 auVar160 [16];
  float fVar167;
  undefined1 auVar161 [16];
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar168;
  undefined1 auVar162 [64];
  float fVar169;
  float fVar170;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar171 [64];
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar181 [16];
  Precalculations pre;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  undefined1 local_3818 [16];
  undefined8 uStack_3800;
  float local_37f8;
  float fStack_37f4;
  float fStack_37f0;
  undefined1 local_37e8 [16];
  BVH *local_37d0;
  Intersectors *local_37c8;
  long local_37c0;
  TravRayK<4,_true> tray;
  undefined1 local_36b8 [16];
  undefined1 local_36a8 [16];
  undefined1 local_3698 [16];
  undefined1 local_3688 [16];
  undefined1 local_3678 [16];
  undefined1 local_3668 [8];
  float fStack_3660;
  float fStack_365c;
  undefined8 local_3658;
  undefined8 uStack_3650;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_3598;
  undefined8 local_3568;
  undefined8 uStack_3560;
  undefined1 local_3558 [16];
  undefined1 local_3548 [16];
  undefined1 local_3538 [16];
  uint local_3528;
  uint uStack_3524;
  uint uStack_3520;
  uint uStack_351c;
  uint uStack_3518;
  uint uStack_3514;
  uint uStack_3510;
  uint uStack_350c;
  Vec3vf<4> Ng;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar142 [16];
  
  local_37d0 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_37d0->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar88 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar69 = vpcmpeqd_avx(auVar88,(undefined1  [16])valid_i->field_0);
    auVar52 = ZEXT816(0) << 0x40;
    auVar13 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar52,5);
    auVar65 = auVar69 & auVar13;
    if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar65[0xf] < '\0')
    {
      auVar13 = vandps_avx(auVar13,auVar69);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar154._8_4_ = 0x7fffffff;
      auVar154._0_8_ = 0x7fffffff7fffffff;
      auVar154._12_4_ = 0x7fffffff;
      auVar69 = vandps_avx(auVar154,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar138._8_4_ = 0x219392ef;
      auVar138._0_8_ = 0x219392ef219392ef;
      auVar138._12_4_ = 0x219392ef;
      auVar65 = vcmpps_avx(auVar69,auVar138,1);
      auVar156._8_4_ = 0x3f800000;
      auVar156._0_8_ = 0x3f8000003f800000;
      auVar156._12_4_ = 0x3f800000;
      auVar111 = vdivps_avx(auVar156,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar69 = vandps_avx(auVar154,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar103 = vcmpps_avx(auVar69,auVar138,1);
      auVar66 = vdivps_avx(auVar156,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar69 = vandps_avx(auVar154,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar69 = vcmpps_avx(auVar69,auVar138,1);
      auVar139._8_4_ = 0x5d5e0b6b;
      auVar139._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar139._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar111,auVar139,auVar65)
      ;
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar66,auVar139,auVar103)
      ;
      auVar65 = vdivps_avx(auVar156,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar65,auVar139,auVar69);
      auVar69 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar52,1);
      auVar111._8_4_ = 0x20;
      auVar111._0_8_ = 0x2000000020;
      auVar111._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar69,auVar111);
      auVar69 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar52,5);
      auVar65._8_4_ = 0x40;
      auVar65._0_8_ = 0x4000000040;
      auVar65._12_4_ = 0x40;
      auVar66._8_4_ = 0x60;
      auVar66._0_8_ = 0x6000000060;
      auVar66._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar66,auVar65,auVar69);
      auVar69 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar52,5);
      auVar103._8_4_ = 0x80;
      auVar103._0_8_ = 0x8000000080;
      auVar103._12_4_ = 0x80;
      auVar112._8_4_ = 0xa0;
      auVar112._0_8_ = 0xa0000000a0;
      auVar112._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar112,auVar103,auVar69);
      auVar69 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar52);
      auVar65 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar52);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar157 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar69,auVar13);
      auVar71 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar69._8_4_ = 0xff800000;
      auVar69._0_8_ = 0xff800000ff800000;
      auVar69._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar69,auVar65,auVar13);
      terminated.field_0.i[1] = auVar13._4_4_ ^ auVar88._4_4_;
      terminated.field_0.i[0] = auVar13._0_4_ ^ auVar88._0_4_;
      terminated.field_0.i[2] = auVar13._8_4_ ^ auVar88._8_4_;
      terminated.field_0.i[3] = auVar13._12_4_ ^ auVar88._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar34 = 3;
      }
      else {
        uVar34 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar35 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar31 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar150 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      local_37c8 = This;
LAB_00fb235d:
      do {
        do {
          root.ptr = pNVar35[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00fb3074;
          pNVar35 = pNVar35 + -1;
          paVar31 = paVar31 + -1;
          vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar31->v;
          auVar171 = ZEXT1664((undefined1  [16])vVar3.field_0);
          auVar88 = vcmpps_avx((undefined1  [16])vVar3.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar27 = vmovmskps_avx(auVar88);
        } while (uVar27 == 0);
        uVar37 = (ulong)(uVar27 & 0xff);
        uVar27 = POPCOUNT(uVar27 & 0xff);
        if (uVar34 < uVar27) {
LAB_00fb239d:
          do {
            vVar25.field_0 = terminated.field_0;
            iVar29 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00fb3074;
              auVar88 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar171._0_16_,6);
              if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar88 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar88 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar88[0xf]) goto LAB_00fb235d;
              local_37c0 = (ulong)((uint)root.ptr & 0xf) - 8;
              local_3818._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              local_3818._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
              local_3818._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
              lVar36 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
              lVar30 = 0;
              goto LAB_00fb25ba;
            }
            sVar33 = 8;
            auVar88 = auVar157._0_16_;
            for (lVar30 = 0;
                (auVar171 = ZEXT1664(auVar88), lVar30 != 8 &&
                (sVar4 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar30 * 8), sVar4 != 8));
                lVar30 = lVar30 + 1) {
              uVar28 = *(undefined4 *)(root.ptr + 0x40 + lVar30 * 4);
              auVar39._4_4_ = uVar28;
              auVar39._0_4_ = uVar28;
              auVar39._8_4_ = uVar28;
              auVar39._12_4_ = uVar28;
              auVar21._8_8_ = tray.org.field_0._8_8_;
              auVar21._0_8_ = tray.org.field_0._0_8_;
              auVar22._8_8_ = tray.org.field_0._24_8_;
              auVar22._0_8_ = tray.org.field_0._16_8_;
              auVar23._8_8_ = tray.org.field_0._40_8_;
              auVar23._0_8_ = tray.org.field_0._32_8_;
              auVar69 = vsubps_avx(auVar39,auVar21);
              auVar104._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar69._0_4_;
              auVar104._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar69._4_4_;
              auVar104._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar69._8_4_;
              auVar104._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar69._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x80 + lVar30 * 4);
              auVar40._4_4_ = uVar28;
              auVar40._0_4_ = uVar28;
              auVar40._8_4_ = uVar28;
              auVar40._12_4_ = uVar28;
              auVar69 = vsubps_avx(auVar40,auVar22);
              auVar119._0_4_ = tray.rdir.field_0._16_4_ * auVar69._0_4_;
              auVar119._4_4_ = tray.rdir.field_0._20_4_ * auVar69._4_4_;
              auVar119._8_4_ = tray.rdir.field_0._24_4_ * auVar69._8_4_;
              auVar119._12_4_ = tray.rdir.field_0._28_4_ * auVar69._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0xc0 + lVar30 * 4);
              auVar41._4_4_ = uVar28;
              auVar41._0_4_ = uVar28;
              auVar41._8_4_ = uVar28;
              auVar41._12_4_ = uVar28;
              auVar69 = vsubps_avx(auVar41,auVar23);
              auVar140._0_4_ = tray.rdir.field_0._32_4_ * auVar69._0_4_;
              auVar140._4_4_ = tray.rdir.field_0._36_4_ * auVar69._4_4_;
              auVar140._8_4_ = tray.rdir.field_0._40_4_ * auVar69._8_4_;
              auVar140._12_4_ = tray.rdir.field_0._44_4_ * auVar69._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x60 + lVar30 * 4);
              auVar42._4_4_ = uVar28;
              auVar42._0_4_ = uVar28;
              auVar42._8_4_ = uVar28;
              auVar42._12_4_ = uVar28;
              auVar69 = vsubps_avx(auVar42,auVar21);
              auVar56._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar69._0_4_;
              auVar56._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar69._4_4_;
              auVar56._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar69._8_4_;
              auVar56._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar69._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0xa0 + lVar30 * 4);
              auVar43._4_4_ = uVar28;
              auVar43._0_4_ = uVar28;
              auVar43._8_4_ = uVar28;
              auVar43._12_4_ = uVar28;
              auVar69 = vsubps_avx(auVar43,auVar22);
              auVar76._0_4_ = tray.rdir.field_0._16_4_ * auVar69._0_4_;
              auVar76._4_4_ = tray.rdir.field_0._20_4_ * auVar69._4_4_;
              auVar76._8_4_ = tray.rdir.field_0._24_4_ * auVar69._8_4_;
              auVar76._12_4_ = tray.rdir.field_0._28_4_ * auVar69._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0xe0 + lVar30 * 4);
              auVar44._4_4_ = uVar28;
              auVar44._0_4_ = uVar28;
              auVar44._8_4_ = uVar28;
              auVar44._12_4_ = uVar28;
              auVar69 = vsubps_avx(auVar44,auVar23);
              auVar94._0_4_ = tray.rdir.field_0._32_4_ * auVar69._0_4_;
              auVar94._4_4_ = tray.rdir.field_0._36_4_ * auVar69._4_4_;
              auVar94._8_4_ = tray.rdir.field_0._40_4_ * auVar69._8_4_;
              auVar94._12_4_ = tray.rdir.field_0._44_4_ * auVar69._12_4_;
              auVar69 = vminps_avx(auVar104,auVar56);
              auVar65 = vminps_avx(auVar119,auVar76);
              auVar69 = vmaxps_avx(auVar69,auVar65);
              auVar65 = vminps_avx(auVar140,auVar94);
              auVar69 = vmaxps_avx(auVar69,auVar65);
              auVar45._0_4_ = auVar150._0_4_ * auVar69._0_4_;
              auVar45._4_4_ = auVar150._4_4_ * auVar69._4_4_;
              auVar45._8_4_ = auVar150._8_4_ * auVar69._8_4_;
              auVar45._12_4_ = auVar150._12_4_ * auVar69._12_4_;
              auVar69 = vmaxps_avx(auVar104,auVar56);
              auVar65 = vmaxps_avx(auVar119,auVar76);
              auVar65 = vminps_avx(auVar69,auVar65);
              auVar69 = vmaxps_avx(auVar140,auVar94);
              auVar69 = vminps_avx(auVar65,auVar69);
              auVar57._0_4_ = auVar162._0_4_ * auVar69._0_4_;
              auVar57._4_4_ = auVar162._4_4_ * auVar69._4_4_;
              auVar57._8_4_ = auVar162._8_4_ * auVar69._8_4_;
              auVar57._12_4_ = auVar162._12_4_ * auVar69._12_4_;
              auVar69 = vmaxps_avx(auVar45,(undefined1  [16])tray.tnear.field_0);
              auVar65 = vminps_avx(auVar57,(undefined1  [16])tray.tfar.field_0);
              auVar65 = vcmpps_avx(auVar69,auVar65,2);
              auVar71 = ZEXT1664(auVar65);
              sVar32 = sVar33;
              auVar69 = auVar88;
              if (((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar65[0xf] < '\0') &&
                 (auVar69 = vblendvps_avx(auVar157._0_16_,auVar45,auVar65), sVar32 = sVar4,
                 sVar33 != 8)) {
                pNVar35->ptr = sVar33;
                pNVar35 = pNVar35 + 1;
                *(undefined1 (*) [16])paVar31->v = auVar88;
                paVar31 = paVar31 + 1;
              }
              auVar88 = auVar69;
              sVar33 = sVar32;
            }
            if (sVar33 == 8) goto LAB_00fb252c;
            auVar69 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar88,6);
            uVar28 = vmovmskps_avx(auVar69);
            root.ptr = sVar33;
          } while ((byte)uVar34 < (byte)POPCOUNT(uVar28));
          pNVar35->ptr = sVar33;
          pNVar35 = pNVar35 + 1;
          *(undefined1 (*) [16])paVar31->v = auVar88;
          paVar31 = paVar31 + 1;
        }
        else {
          while (uVar37 != 0) {
            sVar33 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> sVar33 & 1) == 0; sVar33 = sVar33 + 1) {
              }
            }
            uVar37 = uVar37 & uVar37 - 1;
            auVar71 = ZEXT1664(auVar71._0_16_);
            bVar26 = occluded1(local_37c8,local_37d0,root,sVar33,&pre,ray,&tray,context);
            if (bVar26) {
              terminated.field_0.i[sVar33] = -1;
            }
          }
          auVar88 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar29 = 3;
          auVar157 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar150 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar171 = ZEXT1664((undefined1  [16])vVar3.field_0);
          if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar88 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar88 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar88[0xf] < '\0') {
            auVar71 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar88._8_4_ = 0xff800000;
            auVar88._0_8_ = 0xff800000ff800000;
            auVar88._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar88,
                               (undefined1  [16])terminated.field_0);
            iVar29 = 2;
          }
          if (uVar34 < uVar27) goto LAB_00fb239d;
        }
LAB_00fb252c:
      } while ((iVar29 == 4) || (iVar29 == 2));
LAB_00fb3074:
      auVar13 = vandps_avx(auVar13,(undefined1  [16])terminated.field_0);
      auVar70._8_4_ = 0xff800000;
      auVar70._0_8_ = 0xff800000ff800000;
      auVar70._12_4_ = 0xff800000;
      auVar13 = vmaskmovps_avx(auVar13,auVar70);
      *(undefined1 (*) [16])pRVar1 = auVar13;
    }
  }
  return;
LAB_00fb25ba:
  do {
    lVar38 = -0x10;
    auVar69 = auVar71._0_16_;
    auVar88 = local_3818;
    if (lVar30 == local_37c0) break;
    do {
      if (lVar38 == 0) break;
      uVar27 = *(uint *)(lVar36 + lVar38);
      if ((ulong)uVar27 == 0xffffffff) break;
      uVar28 = *(undefined4 *)(lVar36 + -0x90 + lVar38);
      auVar46._4_4_ = uVar28;
      auVar46._0_4_ = uVar28;
      auVar46._8_4_ = uVar28;
      auVar46._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar36 + -0x80 + lVar38);
      auVar58._4_4_ = uVar28;
      auVar58._0_4_ = uVar28;
      auVar58._8_4_ = uVar28;
      auVar58._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar36 + -0x70 + lVar38);
      auVar77._4_4_ = uVar28;
      auVar77._0_4_ = uVar28;
      auVar77._8_4_ = uVar28;
      auVar77._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar36 + -0x60 + lVar38);
      auVar95._4_4_ = uVar28;
      auVar95._0_4_ = uVar28;
      auVar95._8_4_ = uVar28;
      auVar95._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar36 + -0x50 + lVar38);
      auVar100._4_4_ = uVar28;
      auVar100._0_4_ = uVar28;
      auVar100._8_4_ = uVar28;
      auVar100._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar36 + -0x40 + lVar38);
      auVar105._4_4_ = uVar28;
      auVar105._0_4_ = uVar28;
      auVar105._8_4_ = uVar28;
      auVar105._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar36 + -0x30 + lVar38);
      auVar113._4_4_ = uVar28;
      auVar113._0_4_ = uVar28;
      auVar113._8_4_ = uVar28;
      auVar113._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar36 + -0x20 + lVar38);
      auVar160._4_4_ = uVar28;
      auVar160._0_4_ = uVar28;
      auVar160._8_4_ = uVar28;
      auVar160._12_4_ = uVar28;
      uVar28 = *(undefined4 *)(lVar36 + -0x10 + lVar38);
      auVar125._4_4_ = uVar28;
      auVar125._0_4_ = uVar28;
      auVar125._8_4_ = uVar28;
      auVar125._12_4_ = uVar28;
      auVar69 = *(undefined1 (*) [16])ray;
      auVar65 = *(undefined1 (*) [16])(ray + 0x10);
      auVar52 = *(undefined1 (*) [16])(ray + 0x20);
      auVar103 = vsubps_avx(auVar46,auVar69);
      auVar111 = vsubps_avx(auVar58,auVar65);
      auVar66 = vsubps_avx(auVar77,auVar52);
      auVar112 = vsubps_avx(auVar95,auVar69);
      auVar138 = vsubps_avx(auVar100,auVar65);
      auVar139 = vsubps_avx(auVar105,auVar52);
      auVar154 = vsubps_avx(auVar113,auVar69);
      auVar65 = vsubps_avx(auVar160,auVar65);
      auVar52 = vsubps_avx(auVar125,auVar52);
      auVar69 = vsubps_avx(auVar154,auVar103);
      auVar156 = vsubps_avx(auVar65,auVar111);
      auVar46 = vsubps_avx(auVar52,auVar66);
      fVar178 = auVar111._0_4_;
      fVar110 = fVar178 + auVar65._0_4_;
      fVar182 = auVar111._4_4_;
      fVar116 = fVar182 + auVar65._4_4_;
      fVar184 = auVar111._8_4_;
      fVar117 = fVar184 + auVar65._8_4_;
      fVar186 = auVar111._12_4_;
      fVar118 = fVar186 + auVar65._12_4_;
      fVar7 = auVar66._0_4_;
      fVar123 = auVar52._0_4_ + fVar7;
      fVar9 = auVar66._4_4_;
      fVar130 = auVar52._4_4_ + fVar9;
      fVar91 = auVar66._8_4_;
      fVar132 = auVar52._8_4_ + fVar91;
      fVar11 = auVar66._12_4_;
      fVar134 = auVar52._12_4_ + fVar11;
      fVar55 = auVar46._0_4_;
      auVar141._0_4_ = fVar110 * fVar55;
      fVar14 = auVar46._4_4_;
      auVar141._4_4_ = fVar116 * fVar14;
      fVar15 = auVar46._8_4_;
      auVar141._8_4_ = fVar117 * fVar15;
      fVar16 = auVar46._12_4_;
      auVar141._12_4_ = fVar118 * fVar16;
      fVar169 = auVar156._0_4_;
      auVar148._0_4_ = fVar169 * fVar123;
      fVar172 = auVar156._4_4_;
      auVar148._4_4_ = fVar172 * fVar130;
      fVar174 = auVar156._8_4_;
      auVar148._8_4_ = fVar174 * fVar132;
      fVar176 = auVar156._12_4_;
      auVar148._12_4_ = fVar176 * fVar134;
      auVar156 = vsubps_avx(auVar148,auVar141);
      fVar8 = auVar103._0_4_;
      fVar136 = auVar154._0_4_ + fVar8;
      fVar10 = auVar103._4_4_;
      fVar143 = auVar154._4_4_ + fVar10;
      fVar93 = auVar103._8_4_;
      fVar145 = auVar154._8_4_ + fVar93;
      fVar12 = auVar103._12_4_;
      fVar146 = auVar154._12_4_ + fVar12;
      fVar158 = auVar69._0_4_;
      auVar126._0_4_ = fVar158 * fVar123;
      fVar163 = auVar69._4_4_;
      auVar126._4_4_ = fVar163 * fVar130;
      fVar165 = auVar69._8_4_;
      auVar126._8_4_ = fVar165 * fVar132;
      fVar167 = auVar69._12_4_;
      auVar126._12_4_ = fVar167 * fVar134;
      auVar149._0_4_ = fVar136 * fVar55;
      auVar149._4_4_ = fVar143 * fVar14;
      auVar149._8_4_ = fVar145 * fVar15;
      auVar149._12_4_ = fVar146 * fVar16;
      auVar46 = vsubps_avx(auVar149,auVar126);
      auVar127._0_4_ = fVar136 * fVar169;
      auVar127._4_4_ = fVar143 * fVar172;
      auVar127._8_4_ = fVar145 * fVar174;
      auVar127._12_4_ = fVar146 * fVar176;
      auVar114._0_4_ = fVar158 * fVar110;
      auVar114._4_4_ = fVar163 * fVar116;
      auVar114._8_4_ = fVar165 * fVar117;
      auVar114._12_4_ = fVar167 * fVar118;
      auVar47 = vsubps_avx(auVar114,auVar127);
      auVar69 = *(undefined1 (*) [16])(ray + 0x60);
      fVar110 = auVar69._0_4_;
      fVar118 = auVar69._4_4_;
      fVar132 = auVar69._8_4_;
      fVar143 = auVar69._12_4_;
      auVar69 = *(undefined1 (*) [16])(ray + 0x50);
      fVar170 = auVar69._0_4_;
      fVar173 = auVar69._4_4_;
      fVar175 = auVar69._8_4_;
      fVar177 = auVar69._12_4_;
      fVar17 = *(float *)(ray + 0x40);
      fVar18 = *(float *)(ray + 0x44);
      fVar19 = *(float *)(ray + 0x48);
      auVar24 = *(undefined1 (*) [12])(ray + 0x40);
      fVar20 = *(float *)(ray + 0x4c);
      fVar137 = fVar17 * auVar156._0_4_ + fVar170 * auVar46._0_4_ + auVar47._0_4_ * fVar110;
      fVar144 = fVar18 * auVar156._4_4_ + fVar173 * auVar46._4_4_ + auVar47._4_4_ * fVar118;
      auVar142._0_8_ = CONCAT44(fVar144,fVar137);
      auVar142._8_4_ = fVar19 * auVar156._8_4_ + fVar175 * auVar46._8_4_ + auVar47._8_4_ * fVar132;
      auVar142._12_4_ =
           fVar20 * auVar156._12_4_ + fVar177 * auVar46._12_4_ + auVar47._12_4_ * fVar143;
      auVar69 = vsubps_avx(auVar111,auVar138);
      auVar111 = vsubps_avx(auVar66,auVar139);
      fVar117 = fVar178 + auVar138._0_4_;
      fVar130 = fVar182 + auVar138._4_4_;
      fVar136 = fVar184 + auVar138._8_4_;
      fVar146 = fVar186 + auVar138._12_4_;
      fVar179 = auVar139._0_4_ + fVar7;
      fVar183 = auVar139._4_4_ + fVar9;
      fVar185 = auVar139._8_4_ + fVar91;
      fVar187 = auVar139._12_4_ + fVar11;
      fVar147 = auVar111._0_4_;
      auVar161._0_4_ = fVar147 * fVar117;
      fVar151 = auVar111._4_4_;
      auVar161._4_4_ = fVar151 * fVar130;
      fVar152 = auVar111._8_4_;
      auVar161._8_4_ = fVar152 * fVar136;
      fVar153 = auVar111._12_4_;
      auVar161._12_4_ = fVar153 * fVar146;
      fVar116 = auVar69._0_4_;
      auVar78._0_4_ = fVar179 * fVar116;
      fVar123 = auVar69._4_4_;
      auVar78._4_4_ = fVar183 * fVar123;
      fVar134 = auVar69._8_4_;
      auVar78._8_4_ = fVar185 * fVar134;
      fVar145 = auVar69._12_4_;
      auVar78._12_4_ = fVar187 * fVar145;
      auVar69 = vsubps_avx(auVar78,auVar161);
      auVar103 = vsubps_avx(auVar103,auVar112);
      fVar159 = auVar103._0_4_;
      auVar181._0_4_ = fVar159 * fVar179;
      fVar164 = auVar103._4_4_;
      auVar181._4_4_ = fVar164 * fVar183;
      fVar166 = auVar103._8_4_;
      auVar181._8_4_ = fVar166 * fVar185;
      fVar168 = auVar103._12_4_;
      auVar181._12_4_ = fVar168 * fVar187;
      fVar179 = fVar8 + auVar112._0_4_;
      fVar183 = fVar10 + auVar112._4_4_;
      fVar185 = fVar93 + auVar112._8_4_;
      fVar187 = fVar12 + auVar112._12_4_;
      auVar128._0_4_ = fVar147 * fVar179;
      auVar128._4_4_ = fVar151 * fVar183;
      auVar128._8_4_ = fVar152 * fVar185;
      auVar128._12_4_ = fVar153 * fVar187;
      auVar103 = vsubps_avx(auVar128,auVar181);
      auVar120._0_4_ = fVar179 * fVar116;
      auVar120._4_4_ = fVar183 * fVar123;
      auVar120._8_4_ = fVar185 * fVar134;
      auVar120._12_4_ = fVar187 * fVar145;
      auVar115._0_4_ = fVar159 * fVar117;
      auVar115._4_4_ = fVar164 * fVar130;
      auVar115._8_4_ = fVar166 * fVar136;
      auVar115._12_4_ = fVar168 * fVar146;
      auVar111 = vsubps_avx(auVar115,auVar120);
      auVar121._0_4_ = fVar17 * auVar69._0_4_ + auVar111._0_4_ * fVar110 + fVar170 * auVar103._0_4_;
      auVar121._4_4_ = fVar18 * auVar69._4_4_ + auVar111._4_4_ * fVar118 + fVar173 * auVar103._4_4_;
      auVar121._8_4_ = fVar19 * auVar69._8_4_ + auVar111._8_4_ * fVar132 + fVar175 * auVar103._8_4_;
      auVar121._12_4_ =
           fVar20 * auVar69._12_4_ + auVar111._12_4_ * fVar143 + fVar177 * auVar103._12_4_;
      auVar69 = vsubps_avx(auVar112,auVar154);
      fVar54 = auVar112._0_4_ + auVar154._0_4_;
      fVar72 = auVar112._4_4_ + auVar154._4_4_;
      fVar73 = auVar112._8_4_ + auVar154._8_4_;
      fVar74 = auVar112._12_4_ + auVar154._12_4_;
      auVar103 = vsubps_avx(auVar138,auVar65);
      fVar179 = auVar138._0_4_ + auVar65._0_4_;
      fVar183 = auVar138._4_4_ + auVar65._4_4_;
      fVar185 = auVar138._8_4_ + auVar65._8_4_;
      fVar187 = auVar138._12_4_ + auVar65._12_4_;
      auVar65 = vsubps_avx(auVar139,auVar52);
      fVar75 = auVar139._0_4_ + auVar52._0_4_;
      fVar89 = auVar139._4_4_ + auVar52._4_4_;
      fVar90 = auVar139._8_4_ + auVar52._8_4_;
      fVar92 = auVar139._12_4_ + auVar52._12_4_;
      fVar117 = auVar65._0_4_;
      auVar96._0_4_ = fVar179 * fVar117;
      fVar130 = auVar65._4_4_;
      auVar96._4_4_ = fVar183 * fVar130;
      fVar136 = auVar65._8_4_;
      auVar96._8_4_ = fVar185 * fVar136;
      fVar146 = auVar65._12_4_;
      auVar96._12_4_ = fVar187 * fVar146;
      fVar124 = auVar103._0_4_;
      auVar106._0_4_ = fVar124 * fVar75;
      fVar131 = auVar103._4_4_;
      auVar106._4_4_ = fVar131 * fVar89;
      fVar133 = auVar103._8_4_;
      auVar106._8_4_ = fVar133 * fVar90;
      fVar135 = auVar103._12_4_;
      auVar106._12_4_ = fVar135 * fVar92;
      auVar65 = vsubps_avx(auVar106,auVar96);
      fVar180 = auVar69._0_4_;
      auVar79._0_4_ = fVar180 * fVar75;
      fVar75 = auVar69._4_4_;
      auVar79._4_4_ = fVar75 * fVar89;
      fVar89 = auVar69._8_4_;
      auVar79._8_4_ = fVar89 * fVar90;
      fVar90 = auVar69._12_4_;
      auVar79._12_4_ = fVar90 * fVar92;
      auVar107._0_4_ = fVar54 * fVar117;
      auVar107._4_4_ = fVar72 * fVar130;
      auVar107._8_4_ = fVar73 * fVar136;
      auVar107._12_4_ = fVar74 * fVar146;
      auVar69 = vsubps_avx(auVar107,auVar79);
      auVar108._8_4_ = 0x7fffffff;
      auVar108._0_8_ = 0x7fffffff7fffffff;
      auVar108._12_4_ = 0x7fffffff;
      auVar59._0_4_ = fVar124 * fVar54;
      auVar59._4_4_ = fVar131 * fVar72;
      auVar59._8_4_ = fVar133 * fVar73;
      auVar59._12_4_ = fVar135 * fVar74;
      auVar52._0_4_ = fVar180 * fVar179;
      auVar52._4_4_ = fVar75 * fVar183;
      auVar52._8_4_ = fVar89 * fVar185;
      auVar52._12_4_ = fVar90 * fVar187;
      auVar52 = vsubps_avx(auVar52,auVar59);
      auVar47._0_4_ = fVar17 * auVar65._0_4_ + auVar52._0_4_ * fVar110 + fVar170 * auVar69._0_4_;
      auVar47._4_4_ = fVar18 * auVar65._4_4_ + auVar52._4_4_ * fVar118 + fVar173 * auVar69._4_4_;
      auVar47._8_4_ = fVar19 * auVar65._8_4_ + auVar52._8_4_ * fVar132 + fVar175 * auVar69._8_4_;
      auVar47._12_4_ = fVar20 * auVar65._12_4_ + auVar52._12_4_ * fVar143 + fVar177 * auVar69._12_4_
      ;
      auVar155._0_4_ = auVar47._0_4_ + fVar137 + auVar121._0_4_;
      auVar155._4_4_ = auVar47._4_4_ + fVar144 + auVar121._4_4_;
      auVar155._8_4_ = auVar47._8_4_ + auVar142._8_4_ + auVar121._8_4_;
      auVar155._12_4_ = auVar47._12_4_ + auVar142._12_4_ + auVar121._12_4_;
      auVar69 = vandps_avx(auVar155,auVar108);
      auVar60._0_4_ = auVar69._0_4_ * 1.1920929e-07;
      auVar60._4_4_ = auVar69._4_4_ * 1.1920929e-07;
      auVar60._8_4_ = auVar69._8_4_ * 1.1920929e-07;
      auVar60._12_4_ = auVar69._12_4_ * 1.1920929e-07;
      auVar69 = vminps_avx(auVar142,auVar121);
      auVar69 = vminps_avx(auVar69,auVar47);
      uVar37 = CONCAT44(auVar60._4_4_,auVar60._0_4_);
      auVar97._0_8_ = uVar37 ^ 0x8000000080000000;
      auVar97._8_4_ = -auVar60._8_4_;
      auVar97._12_4_ = -auVar60._12_4_;
      auVar69 = vcmpps_avx(auVar69,auVar97,5);
      auVar65 = vmaxps_avx(auVar142,auVar121);
      auVar65 = vmaxps_avx(auVar65,auVar47);
      auVar65 = vcmpps_avx(auVar65,auVar60,2);
      auVar69 = vorps_avx(auVar69,auVar65);
      auVar65 = auVar88 & auVar69;
      auVar69 = vandps_avx(auVar69,auVar88);
      if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar65[0xf] < '\0'
         ) {
        auVar48._0_4_ = fVar116 * fVar55;
        auVar48._4_4_ = fVar123 * fVar14;
        auVar48._8_4_ = fVar134 * fVar15;
        auVar48._12_4_ = fVar145 * fVar16;
        auVar61._0_4_ = fVar169 * fVar147;
        auVar61._4_4_ = fVar172 * fVar151;
        auVar61._8_4_ = fVar174 * fVar152;
        auVar61._12_4_ = fVar176 * fVar153;
        auVar103 = vsubps_avx(auVar61,auVar48);
        auVar80._0_4_ = fVar124 * fVar147;
        auVar80._4_4_ = fVar131 * fVar151;
        auVar80._8_4_ = fVar133 * fVar152;
        auVar80._12_4_ = fVar135 * fVar153;
        auVar98._0_4_ = fVar116 * fVar117;
        auVar98._4_4_ = fVar123 * fVar130;
        auVar98._8_4_ = fVar134 * fVar136;
        auVar98._12_4_ = fVar145 * fVar146;
        auVar111 = vsubps_avx(auVar98,auVar80);
        auVar65 = vandps_avx(auVar48,auVar108);
        auVar52 = vandps_avx(auVar80,auVar108);
        auVar65 = vcmpps_avx(auVar65,auVar52,1);
        auVar103 = vblendvps_avx(auVar111,auVar103,auVar65);
        auVar49._0_4_ = fVar159 * fVar117;
        auVar49._4_4_ = fVar164 * fVar130;
        auVar49._8_4_ = fVar166 * fVar136;
        auVar49._12_4_ = fVar168 * fVar146;
        auVar62._0_4_ = fVar159 * fVar55;
        auVar62._4_4_ = fVar164 * fVar14;
        auVar62._8_4_ = fVar166 * fVar15;
        auVar62._12_4_ = fVar168 * fVar16;
        auVar81._0_4_ = fVar147 * fVar158;
        auVar81._4_4_ = fVar151 * fVar163;
        auVar81._8_4_ = fVar152 * fVar165;
        auVar81._12_4_ = fVar153 * fVar167;
        auVar111 = vsubps_avx(auVar62,auVar81);
        auVar101._0_4_ = fVar180 * fVar147;
        auVar101._4_4_ = fVar75 * fVar151;
        auVar101._8_4_ = fVar89 * fVar152;
        auVar101._12_4_ = fVar90 * fVar153;
        auVar66 = vsubps_avx(auVar101,auVar49);
        auVar65 = vandps_avx(auVar81,auVar108);
        auVar52 = vandps_avx(auVar49,auVar108);
        auVar65 = vcmpps_avx(auVar65,auVar52,1);
        auVar111 = vblendvps_avx(auVar66,auVar111,auVar65);
        auVar63._0_4_ = fVar180 * fVar116;
        auVar63._4_4_ = fVar75 * fVar123;
        auVar63._8_4_ = fVar89 * fVar134;
        auVar63._12_4_ = fVar90 * fVar145;
        auVar82._0_4_ = fVar116 * fVar158;
        auVar82._4_4_ = fVar123 * fVar163;
        auVar82._8_4_ = fVar134 * fVar165;
        auVar82._12_4_ = fVar145 * fVar167;
        auVar102._0_4_ = fVar159 * fVar169;
        auVar102._4_4_ = fVar164 * fVar172;
        auVar102._8_4_ = fVar166 * fVar174;
        auVar102._12_4_ = fVar168 * fVar176;
        auVar109._0_4_ = fVar159 * fVar124;
        auVar109._4_4_ = fVar164 * fVar131;
        auVar109._8_4_ = fVar166 * fVar133;
        auVar109._12_4_ = fVar168 * fVar135;
        auVar66 = vsubps_avx(auVar82,auVar102);
        auVar112 = vsubps_avx(auVar109,auVar63);
        auVar65 = vandps_avx(auVar108,auVar102);
        auVar52 = vandps_avx(auVar108,auVar63);
        auVar65 = vcmpps_avx(auVar65,auVar52,1);
        auVar52 = vblendvps_avx(auVar112,auVar66,auVar65);
        local_37f8 = auVar24._0_4_;
        fStack_37f4 = auVar24._4_4_;
        fStack_37f0 = auVar24._8_4_;
        fVar55 = auVar103._0_4_ * local_37f8 + auVar52._0_4_ * fVar110 + auVar111._0_4_ * fVar170;
        fVar110 = auVar103._4_4_ * fStack_37f4 + auVar52._4_4_ * fVar118 + auVar111._4_4_ * fVar173;
        fVar116 = auVar103._8_4_ * fStack_37f0 + auVar52._8_4_ * fVar132 + auVar111._8_4_ * fVar175;
        fVar117 = auVar103._12_4_ * fVar20 + auVar52._12_4_ * fVar143 + auVar111._12_4_ * fVar177;
        auVar64._0_4_ = fVar55 + fVar55;
        auVar64._4_4_ = fVar110 + fVar110;
        auVar64._8_4_ = fVar116 + fVar116;
        auVar64._12_4_ = fVar117 + fVar117;
        fVar55 = auVar103._0_4_ * fVar8 + auVar52._0_4_ * fVar7 + auVar111._0_4_ * fVar178;
        fVar110 = auVar103._4_4_ * fVar10 + auVar52._4_4_ * fVar9 + auVar111._4_4_ * fVar182;
        fVar91 = auVar103._8_4_ * fVar93 + auVar52._8_4_ * fVar91 + auVar111._8_4_ * fVar184;
        fVar93 = auVar103._12_4_ * fVar12 + auVar52._12_4_ * fVar11 + auVar111._12_4_ * fVar186;
        auVar65 = vrcpps_avx(auVar64);
        fVar7 = auVar65._0_4_;
        auVar122._0_4_ = auVar64._0_4_ * fVar7;
        fVar8 = auVar65._4_4_;
        auVar122._4_4_ = auVar64._4_4_ * fVar8;
        fVar9 = auVar65._8_4_;
        auVar122._8_4_ = auVar64._8_4_ * fVar9;
        fVar10 = auVar65._12_4_;
        auVar122._12_4_ = auVar64._12_4_ * fVar10;
        auVar129._8_4_ = 0x3f800000;
        auVar129._0_8_ = 0x3f8000003f800000;
        auVar129._12_4_ = 0x3f800000;
        auVar65 = vsubps_avx(auVar129,auVar122);
        auVar83._0_4_ = (fVar55 + fVar55) * (fVar7 + fVar7 * auVar65._0_4_);
        auVar83._4_4_ = (fVar110 + fVar110) * (fVar8 + fVar8 * auVar65._4_4_);
        auVar83._8_4_ = (fVar91 + fVar91) * (fVar9 + fVar9 * auVar65._8_4_);
        auVar83._12_4_ = (fVar93 + fVar93) * (fVar10 + fVar10 * auVar65._12_4_);
        auVar65 = vcmpps_avx(auVar83,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar66 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar83,2);
        auVar65 = vandps_avx(auVar66,auVar65);
        auVar66 = vcmpps_avx(auVar64,_DAT_01f45a50,4);
        auVar65 = vandps_avx(auVar66,auVar65);
        auVar65 = vpslld_avx(auVar65,0x1f);
        auVar66 = vpsrad_avx(auVar65,0x1f);
        auVar65 = auVar69 & auVar66;
        auVar69 = vandps_avx(auVar69,auVar66);
        if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar65[0xf] < '\0') {
          uStack_3800 = auVar142._8_8_;
          uStack_3650 = uStack_3800;
          local_36b8 = auVar52;
          local_36a8 = auVar111;
          local_3698 = auVar103;
          local_3688 = auVar83;
          local_3678 = auVar155;
          _local_3668 = auVar121;
          local_3658 = auVar142._0_8_;
        }
      }
      auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar157 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar150 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      pGVar5 = (context->scene->geometries).items[uVar27].ptr;
      uVar2 = pGVar5->mask;
      auVar50._4_4_ = uVar2;
      auVar50._0_4_ = uVar2;
      auVar50._8_4_ = uVar2;
      auVar50._12_4_ = uVar2;
      auVar65 = vandps_avx(auVar50,*(undefined1 (*) [16])(ray + 0x90));
      auVar65 = vpcmpeqd_avx(auVar65,_DAT_01f45a50);
      auVar52 = auVar69 & ~auVar65;
      if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar52[0xf] < '\0'
         ) {
        uVar2 = *(uint *)(lVar36 + 0x10 + lVar38);
        auVar69 = vandnps_avx(auVar65,auVar69);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar65 = vandps_avx(local_3678,auVar108);
          auVar52 = vrcpps_avx(local_3678);
          fVar7 = auVar52._0_4_;
          auVar84._0_4_ = local_3678._0_4_ * fVar7;
          fVar8 = auVar52._4_4_;
          auVar84._4_4_ = local_3678._4_4_ * fVar8;
          fVar9 = auVar52._8_4_;
          auVar84._8_4_ = local_3678._8_4_ * fVar9;
          fVar10 = auVar52._12_4_;
          auVar84._12_4_ = local_3678._12_4_ * fVar10;
          auVar99._8_4_ = 0x3f800000;
          auVar99._0_8_ = 0x3f8000003f800000;
          auVar99._12_4_ = 0x3f800000;
          auVar52 = vsubps_avx(auVar99,auVar84);
          auVar67._0_4_ = fVar7 + fVar7 * auVar52._0_4_;
          auVar67._4_4_ = fVar8 + fVar8 * auVar52._4_4_;
          auVar67._8_4_ = fVar9 + fVar9 * auVar52._8_4_;
          auVar67._12_4_ = fVar10 + fVar10 * auVar52._12_4_;
          auVar85._8_4_ = 0x219392ef;
          auVar85._0_8_ = 0x219392ef219392ef;
          auVar85._12_4_ = 0x219392ef;
          auVar65 = vcmpps_avx(auVar65,auVar85,5);
          auVar65 = vandps_avx(auVar65,auVar67);
          auVar68._0_4_ = auVar65._0_4_ * (float)local_3658;
          auVar68._4_4_ = auVar65._4_4_ * local_3658._4_4_;
          auVar68._8_4_ = auVar65._8_4_ * (float)uStack_3650;
          auVar68._12_4_ = auVar65._12_4_ * uStack_3650._4_4_;
          local_3548 = vminps_avx(auVar68,auVar99);
          auVar51._0_4_ = auVar65._0_4_ * (float)local_3668._0_4_;
          auVar51._4_4_ = auVar65._4_4_ * (float)local_3668._4_4_;
          auVar51._8_4_ = auVar65._8_4_ * fStack_3660;
          auVar51._12_4_ = auVar65._12_4_ * fStack_365c;
          local_3558 = vminps_avx(auVar51,auVar99);
          local_3598._0_8_ = local_3698._0_8_;
          local_3598._8_8_ = local_3698._8_8_;
          local_3598._16_8_ = local_36a8._0_8_;
          local_3598._24_8_ = local_36a8._8_8_;
          local_3598._32_8_ = local_36b8._0_8_;
          local_3598._40_8_ = local_36b8._8_8_;
          local_3568 = local_3688._0_8_;
          uStack_3560 = local_3688._8_8_;
          args.valid = (int *)&Ng;
          args.geometryUserPtr = &t;
          args.context = (RTCRayQueryContext *)&v;
          args.ray = (RTCRayN *)&u;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
          ::
          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                               *)&local_3598.field_0);
          local_3538 = vpshufd_avx(ZEXT416(uVar27),0);
          auVar65 = ZEXT416(uVar2);
          local_3548 = vshufps_avx(auVar65,auVar65,0);
          local_3598._0_8_ = Ng.field_0._0_8_;
          local_3598._8_8_ = Ng.field_0._8_8_;
          local_3598._16_8_ = Ng.field_0._16_8_;
          local_3598._24_8_ = Ng.field_0._24_8_;
          local_3598._32_8_ = Ng.field_0._32_8_;
          local_3598._40_8_ = Ng.field_0._40_8_;
          local_3568 = u.field_0._0_8_;
          uStack_3560 = u.field_0._8_8_;
          vcmpps_avx(ZEXT1632(local_3538),ZEXT1632(local_3538),0xf);
          uStack_3524 = context->user->instID[0];
          local_3528 = uStack_3524;
          uStack_3520 = uStack_3524;
          uStack_351c = uStack_3524;
          uStack_3518 = context->user->instPrimID[0];
          uStack_3514 = uStack_3518;
          uStack_3510 = uStack_3518;
          uStack_350c = uStack_3518;
          auVar65 = *(undefined1 (*) [16])(ray + 0x80);
          auVar52 = vblendvps_avx(auVar65,(undefined1  [16])t.field_0,auVar69);
          *(undefined1 (*) [16])(ray + 0x80) = auVar52;
          args.valid = (int *)local_37e8;
          args.geometryUserPtr = pGVar5->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_3598;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          local_37e8 = auVar69;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar5->occlusionFilterN)(&args);
          }
          if (local_37e8 == (undefined1  [16])0x0) {
            auVar69 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
            auVar69 = auVar69 ^ _DAT_01f46b70;
            auVar157 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar150 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          }
          else {
            p_Var6 = context->args->filter;
            if (p_Var6 == (RTCFilterFunctionN)0x0) {
              auVar157 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar150 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            }
            else {
              auVar157 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar150 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var6)(&args);
                auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                auVar150 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar157 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
            }
            auVar52 = vpcmpeqd_avx(local_37e8,_DAT_01f45a50);
            auVar69 = auVar52 ^ _DAT_01f46b70;
            auVar86._8_4_ = 0xff800000;
            auVar86._0_8_ = 0xff800000ff800000;
            auVar86._12_4_ = 0xff800000;
            auVar52 = vblendvps_avx(auVar86,*(undefined1 (*) [16])(args.ray + 0x80),auVar52);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar52;
          }
          auVar52 = vpslld_avx(auVar69,0x1f);
          auVar69 = vpsrad_avx(auVar52,0x1f);
          auVar65 = vblendvps_avx(auVar65,*(undefined1 (*) [16])pRVar1,auVar52);
          *(undefined1 (*) [16])pRVar1 = auVar65;
        }
        auVar88 = vandnps_avx(auVar69,auVar88);
      }
      lVar38 = lVar38 + 4;
    } while ((((auVar88 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar88 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar88 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar88[0xf] < '\0');
    auVar71 = ZEXT1664(local_3818);
    auVar65 = vandps_avx(auVar88,local_3818);
    lVar30 = lVar30 + 1;
    lVar36 = lVar36 + 0xb0;
    auVar88 = local_3818 & auVar88;
    auVar69 = local_3818;
    local_3818 = auVar65;
  } while ((((auVar88 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar88 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar88 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar88[0xf] < '\0');
  auVar88 = vpcmpeqd_avx(auVar69,auVar69);
  auVar53._0_4_ = local_3818._0_4_ ^ auVar88._0_4_;
  auVar53._4_4_ = local_3818._4_4_ ^ auVar88._4_4_;
  auVar53._8_4_ = local_3818._8_4_ ^ auVar88._8_4_;
  auVar53._12_4_ = local_3818._12_4_ ^ auVar88._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar53,(undefined1  [16])vVar25.field_0);
  auVar88 = auVar88 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar88 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar88 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar88[0xf])
  goto LAB_00fb3074;
  auVar71 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
  auVar87._8_4_ = 0xff800000;
  auVar87._0_8_ = 0xff800000ff800000;
  auVar87._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar87,
                     (undefined1  [16])terminated.field_0);
  goto LAB_00fb235d;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }